

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_Blake2s.c
# Opt level: O0

void Hacl_Hash_Blake2s_hash_with_key
               (uint8_t *output,uint32_t output_len,uint8_t *input,uint32_t input_len,uint8_t *key,
               uint32_t key_len)

{
  uint32_t local_b8 [2];
  uint32_t b1 [16];
  uint32_t b [16];
  uint32_t key_len_local;
  uint8_t *key_local;
  uint32_t input_len_local;
  uint8_t *input_local;
  uint32_t output_len_local;
  uint8_t *output_local;
  
  memset(b1 + 0xe,0,0x40);
  memset(local_b8,0,0x40);
  Hacl_Hash_Blake2s_init(b1 + 0xe,key_len,output_len);
  update(local_b8,b1 + 0xe,key_len,key,input_len,input);
  Hacl_Hash_Blake2s_finish(output_len,output,b1 + 0xe);
  Lib_Memzero0_memzero0(local_b8,0x40);
  Lib_Memzero0_memzero0(b1 + 0xe,0x40);
  return;
}

Assistant:

void
Hacl_Hash_Blake2s_hash_with_key(
  uint8_t *output,
  uint32_t output_len,
  uint8_t *input,
  uint32_t input_len,
  uint8_t *key,
  uint32_t key_len
)
{
  uint32_t b[16U] = { 0U };
  uint32_t b1[16U] = { 0U };
  Hacl_Hash_Blake2s_init(b, key_len, output_len);
  update(b1, b, key_len, key, input_len, input);
  Hacl_Hash_Blake2s_finish(output_len, output, b);
  Lib_Memzero0_memzero(b1, 16U, uint32_t, void *);
  Lib_Memzero0_memzero(b, 16U, uint32_t, void *);
}